

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tree_base(nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
                nk_collapse_states initial_state,char *hash,int len,int line)

{
  nk_window *win;
  nk_hash name;
  int iVar1;
  nk_collapse_states *state;
  nk_uint value;
  char *pcVar2;
  
  win = ctx->current;
  pcVar2 = title;
  if (hash == (char *)0x0) {
    len = nk_strlen(title);
    hash = title;
  }
  value = (nk_uint)pcVar2;
  name = nk_murmur_hash(hash,len,line);
  state = nk_find_value(win,name);
  if (state == (nk_collapse_states *)0x0) {
    state = nk_add_value(ctx,win,name,value);
    *state = initial_state;
  }
  iVar1 = nk_tree_state_base(ctx,type,img,title,state);
  return iVar1;
}

Assistant:

NK_INTERN int
nk_tree_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
    const char *hash, int len, int line)
{
    struct nk_window *win = ctx->current;
    int title_len = 0;
    nk_hash tree_hash = 0;
    nk_uint *state = 0;

    /* retrieve tree state from internal widget state tables */
    if (!hash) {
        title_len = (int)nk_strlen(title);
        tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
    } else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
    state = nk_find_value(win, tree_hash);
    if (!state) {
        state = nk_add_value(ctx, win, tree_hash, 0);
        *state = initial_state;
    }
    return nk_tree_state_base(ctx, type, img, title, (enum nk_collapse_states*)state);
}